

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O0

int Gia_Sim2InfoIsZero(Gia_Sim2_t *p,uint *pInfo)

{
  int iVar1;
  int local_24;
  int w;
  uint *pInfo_local;
  Gia_Sim2_t *p_local;
  
  local_24 = 0;
  while( true ) {
    if (p->nWords <= local_24) {
      return -1;
    }
    if (pInfo[local_24] != 0) break;
    local_24 = local_24 + 1;
  }
  iVar1 = Gia_WordFindFirstBit(pInfo[local_24]);
  return local_24 * 0x20 + iVar1;
}

Assistant:

static inline int Gia_Sim2InfoIsZero( Gia_Sim2_t * p, unsigned * pInfo )
{
    int w;
    for ( w = 0; w < p->nWords; w++ )
        if ( pInfo[w] )
            return 32*w + Gia_WordFindFirstBit( pInfo[w] );
    return -1;
}